

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O0

QList<QSslCertificate> *
QTlsPrivate::X509CertificateOpenSSL::certificatesFromDer(QByteArray *der,int count)

{
  qsizetype qVar1;
  X509 *pXVar2;
  char *pcVar3;
  int in_EDX;
  X509 *in_RSI;
  QList<QSslCertificate> *in_RDI;
  long in_FS_OFFSET;
  X509 *x509;
  int size;
  QList<QSslCertificate> *certificates;
  uchar *data;
  rvalue_ref in_stack_ffffffffffffff98;
  QList<QSslCertificate> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  bool bVar4;
  int local_34;
  QSslCertificate local_18;
  QList<QSslCertificate> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QSslCertificate *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QList<QSslCertificate>::QList((QList<QSslCertificate> *)0x13a82b);
  local_10 = (QList<QSslCertificate> *)QByteArray::data((QByteArray *)in_stack_ffffffffffffffa0);
  qVar1 = QByteArray::size((QByteArray *)in_RSI);
  local_34 = (int)qVar1;
  while( true ) {
    bVar4 = false;
    if ((0 < local_34) &&
       (in_stack_ffffffffffffffae = true, bVar4 = (bool)in_stack_ffffffffffffffae, in_EDX != -1)) {
      qVar1 = QList<QSslCertificate>::size(in_RDI);
      in_stack_ffffffffffffffae = qVar1 < in_EDX;
      bVar4 = (bool)in_stack_ffffffffffffffae;
    }
    if ((bVar4 == false) ||
       (pXVar2 = q_d2i_X509((X509 **)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffae,
                                                             in_stack_ffffffffffffffa8)),
                            (uchar **)in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98),
       pXVar2 == (X509 *)0x0)) break;
    certificateFromX509(in_RSI);
    QList<QSslCertificate>::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QSslCertificate::~QSslCertificate(&local_18);
    q_X509_free((X509 *)0x13a8e2);
    in_stack_ffffffffffffffa0 = local_10;
    pcVar3 = QByteArray::data((QByteArray *)local_10);
    local_34 = local_34 - ((int)in_stack_ffffffffffffffa0 - (int)pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificate> X509CertificateOpenSSL::certificatesFromDer(const QByteArray &der, int count)
{
    QList<QSslCertificate> certificates;

    const unsigned char *data = (const unsigned char *)der.data();
    int size = der.size();

    while (size > 0 && (count == -1 || certificates.size() < count)) {
        if (X509 *x509 = q_d2i_X509(nullptr, &data, size)) {
            certificates << certificateFromX509(x509);
            q_X509_free(x509);
        } else {
            break;
        }
        size -= ((const char *)data - der.data());
    }

    return certificates;
}